

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O0

void libxml_domnode_binary_insertion_sort_start(xmlNodePtr *dst,size_t start,size_t size)

{
  xmlNodePtr x_00;
  int iVar1;
  xmlNodePtr pxVar2;
  size_t location;
  xmlNodePtr x;
  size_t j;
  size_t i;
  size_t size_local;
  size_t start_local;
  xmlNodePtr *dst_local;
  
  j = start;
  do {
    if (size <= j) {
      return;
    }
    iVar1 = wrap_cmp(dst[j - 1],dst[j]);
    if (0 < iVar1) {
      x_00 = dst[j];
      pxVar2 = (xmlNodePtr)libxml_domnode_binary_insertion_find(dst,x_00,j);
      x = (xmlNodePtr)j;
      do {
        x = (xmlNodePtr)&x[-1].field_0x77;
        if (x < pxVar2) break;
        dst[(long)((long)&x->_private + 1)] = dst[(long)x];
      } while (x != (xmlNodePtr)0x0);
      dst[(long)pxVar2] = x_00;
    }
    j = j + 1;
  } while( true );
}

Assistant:

static void BINARY_INSERTION_SORT_START(SORT_TYPE *dst, const size_t start, const size_t size) {
  size_t i;

  for (i = start; i < size; i++) {
    size_t j;
    SORT_TYPE x;
    size_t location;

    /* If this entry is already correct, just move along */
    if (SORT_CMP(dst[i - 1], dst[i]) <= 0) {
      continue;
    }

    /* Else we need to find the right place, shift everything over, and squeeze in */
    x = dst[i];
    location = BINARY_INSERTION_FIND(dst, x, i);

    for (j = i - 1; j >= location; j--) {
      dst[j + 1] = dst[j];

      if (j == 0) { /* check edge case because j is unsigned */
        break;
      }
    }

    dst[location] = x;
  }
}